

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

size_type __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
::erase_unique<long>
          (btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
           *this,long *key)

{
  bool bVar1;
  iterator iVar2;
  iterator iter_00;
  iterator iter;
  long *key_local;
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *this_local;
  
  iVar2 = internal_find<long>(this,key);
  bVar1 = iVar2.node !=
          (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
           *)0x0;
  if (bVar1) {
    iter_00._12_4_ = 0;
    iter_00.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)SUB128(iVar2._0_12_,0);
    iter_00.position = SUB124(iVar2._0_12_,8);
    erase(this,iter_00);
  }
  this_local = (btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                *)(ulong)bVar1;
  return (size_type)this_local;
}

Assistant:

auto btree<P>::erase_unique(const K &key) -> size_type {
        const iterator iter = internal_find(key);
        if (iter.node == nullptr) {
            // The key doesn't exist in the tree, return nothing done.
            return 0;
        }
        erase(iter);
        return 1;
    }